

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

reference __thiscall
absl::lts_20250127::container_internal::
btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
::operator*(btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
            *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
  *pbVar4;
  uint uVar5;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
  *this_00;
  
  this_00 = (btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
             *)this->node_;
  if (this_00 ==
      (btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_const_std::basic_string_view<char,_std::char_traits<char>_>_*>
       *)0x0) {
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
                 *)0x0);
LAB_0060723a:
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
                 *)this_00);
LAB_0060723f:
    btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
    ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
                 *)this_00);
  }
  else {
    iVar1 = this->position_;
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
            ::start((btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>
                     *)this_00);
    if (iVar1 < (int)(uint)bVar2) goto LAB_0060723a;
    pbVar4 = this->node_;
    if (((ulong)pbVar4 & 7) != 0) goto LAB_00607249;
    uVar5 = this->position_;
    if ((int)uVar5 < (int)(uint)(byte)pbVar4[10]) {
LAB_00607221:
      return (reference)(pbVar4 + (ulong)((uVar5 & 0xff) << 4) + 0x10);
    }
    this_00 = this;
    bVar3 = IsEndIterator(this);
    if (bVar3) goto LAB_0060723f;
    pbVar4 = this->node_;
    if (((ulong)pbVar4 & 7) != 0) goto LAB_00607249;
    uVar5 = this->position_;
    if ((int)uVar5 < (int)(uint)(byte)pbVar4[10]) goto LAB_00607221;
  }
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>const,std::basic_string_view<char,std::char_traits<char>>const&,std::basic_string_view<char,std::char_traits<char>>const*>
               *)this_00);
LAB_00607249:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *, unsigned int, unsigned char, std::basic_string_view<char>, absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *, unsigned int, unsigned char, std::basic_string_view<char>, absl::container_internal::btree_node<absl::container_internal::set_params<std::basic_string_view<char>, std::less<std::basic_string_view<char>>, std::allocator<std::basic_string_view<char>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 15, 16>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    assert_valid_generation(node_);
    ABSL_HARDENING_ASSERT(position_ >= node_->start());
    if (position_ >= node_->finish()) {
      ABSL_HARDENING_ASSERT(!IsEndIterator() && "Dereferencing end() iterator");
      ABSL_HARDENING_ASSERT(position_ < node_->finish());
    }
    return node_->value(static_cast<field_type>(position_));
  }